

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acb.h
# Opt level: O0

void Acb_NtkAdd(Acb_Man_t *p,Acb_Ntk_t *pNtk)

{
  Abc_Nam_t *p_00;
  int iVar1;
  char *pcVar2;
  int local_1c;
  int NtkId;
  int fFound;
  Acb_Ntk_t *pNtk_local;
  Acb_Man_t *p_local;
  
  p_00 = p->pMods;
  _NtkId = pNtk;
  pNtk_local = (Acb_Ntk_t *)p;
  pcVar2 = Acb_NtkName(pNtk);
  iVar1 = Abc_NamStrFindOrAdd(p_00,pcVar2,&local_1c);
  if (local_1c == 0) {
    if (iVar1 != _NtkId->Id) {
      __assert_fail("NtkId == pNtk->Id",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acb.h"
                    ,0x2a0,"void Acb_NtkAdd(Acb_Man_t *, Acb_Ntk_t *)");
    }
  }
  else {
    pcVar2 = Acb_NtkName(_NtkId);
    printf("Network with name \"%s\" already exists.\n",pcVar2);
  }
  return;
}

Assistant:

static inline void Acb_NtkAdd( Acb_Man_t * p, Acb_Ntk_t * pNtk )
{    
    int fFound, NtkId = Abc_NamStrFindOrAdd( p->pMods, Acb_NtkName(pNtk), &fFound );
    if ( fFound )
        printf( "Network with name \"%s\" already exists.\n", Acb_NtkName(pNtk) );
    else
        assert( NtkId == pNtk->Id );
}